

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

SymbolTable * make_symbol_table(void)

{
  Bucket **ppBVar1;
  Bucket *pBVar2;
  int local_1c;
  Bucket **ppBStack_18;
  int i;
  Bucket **b;
  SymbolTable *s;
  
  ppBVar1 = (Bucket **)malloc(0x7e8);
  ppBStack_18 = ppBVar1;
  for (local_1c = 0; local_1c < 0xfd; local_1c = local_1c + 1) {
    pBVar2 = (Bucket *)malloc(0x78);
    *ppBStack_18 = pBVar2;
    (*ppBStack_18)->num_symbols = 0;
    (*ppBStack_18)->max_symbols = 7;
    ppBStack_18 = ppBStack_18 + 1;
  }
  return (SymbolTable *)ppBVar1;
}

Assistant:

SymbolTable *
make_symbol_table (void)
{
  SymbolTable *s = malloc (sizeof (SymbolTable));
  Bucket **b;
  int i;

  for (i = 0, b = &s->bucket[0]; i < HASH_BUCKETS; i++, b++)
    {
      *b = (Bucket *) malloc (sizeof (Bucket));
      (*b)->num_symbols = 0;
      (*b)->max_symbols = INITIAL_SYMBOLS;
    }

  return s;
}